

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void to_bottom_objects_proc(Am_Object *cmd)

{
  Am_Value local_28;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *cmd_local;
  
  local_10 = cmd;
  Am_Object::Am_Object(&local_18,cmd);
  Am_Value::Am_Value(&local_28,&Am_No_Value);
  do_to_top_or_bottom(&local_18,false,&local_28);
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, to_bottom_objects, (Am_Object cmd))
{
  do_to_top_or_bottom(cmd, false);
}